

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O3

string * __thiscall
OSTEIDeriv1_Writer::FunctionPrototype__abi_cxx11_
          (string *__return_storage_ptr__,OSTEIDeriv1_Writer *this,QAM *am)

{
  pointer pcVar1;
  ostream *poVar2;
  string indent;
  string fname;
  string local_228;
  string local_208;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [24];
  stringstream ss;
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1e8 = (am->qam)._M_elems[0];
  iStack_1e4 = (am->qam)._M_elems[1];
  iStack_1e0 = (am->qam)._M_elems[2];
  iStack_1dc = (am->qam)._M_elems[3];
  pcVar1 = (am->tag)._M_dataplus._M_p;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar1,pcVar1 + (am->tag)._M_string_length);
  StringBuilder<char[14],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (&fname,(char (*) [14])"ostei_deriv1_",
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + local_1e8,
             (char (*) [2])0x148cbc,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + iStack_1e4,
             (char (*) [2])0x148cbc,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + iStack_1e0,
             (char (*) [2])0x148cbc,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" + iStack_1dc);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)fname._M_string_length + '\x05');
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"int ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,fname._M_dataplus._M_p,fname._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"struct simint_multi_shellpair const P,\n",0x27);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,indent._M_dataplus._M_p,indent._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"struct simint_multi_shellpair const Q,\n",0x27);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,indent._M_dataplus._M_p,indent._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"double screen_tol,\n",0x13);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,indent._M_dataplus._M_p,indent._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"double * const restrict work,\n",0x1e);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,indent._M_dataplus._M_p,indent._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"double * const restrict ",0x18);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
  ArrVarName(&local_208,am,&local_228);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)indent._M_dataplus._M_p != &indent.field_2) {
    operator_delete(indent._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OSTEIDeriv1_Writer::FunctionPrototype_(QAM am) const
{
    std::string fname = FunctionName_(am);
    std::string indent(fname.length()+1+4, ' '); // +4 for return type

    std::stringstream ss;
    ss << "int " << fname << "(";
    ss << "struct simint_multi_shellpair const P,\n";
    ss << indent << "struct simint_multi_shellpair const Q,\n";
    ss << indent << "double screen_tol,\n";
    ss << indent << "double * const restrict work,\n";
    ss << indent << "double * const restrict " << ArrVarName(am) << ")";
    return ss.str();
}